

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::compute_order::
run<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,double>
          (compute_order *this,
          solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
          *solver,bit_array *x,random_engine *rng,double kappa,double delta,double theta)

{
  int iVar1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_28;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_20;
  
  switch(this->order) {
  case reversing:
    local_20.current._M_current =
         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
         (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_28.current._M_current =
         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
         (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
    ::
    compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
              ((solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
                *)solver,x,&local_20,&local_28,kappa,delta,theta);
    iVar1 = compute_violated_constraints<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array>
                      (solver,x,&this->R);
    return iVar1;
  case random_sorting:
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,rng);
  default:
    solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
    ::
    compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
                *)solver,x,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,kappa,delta,theta);
    goto LAB_004f0f7a;
  case infeasibility_decr:
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::compute_order::run<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,double>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,double,double,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              ((this->m_order).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->m_order).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    goto LAB_004f0eb2;
  case infeasibility_incr:
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::compute_order::run<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,double>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,double,double,double)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              ((this->m_order).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->m_order).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
LAB_004f0eb2:
    solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
    ::
    compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
                *)solver,x,
               (this->m_order).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->m_order).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,kappa,delta,theta);
    iVar1 = infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array>
                      (this,solver,x);
    return iVar1;
  case lagrangian_decr:
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::compute_order::run<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,double>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,double,double,double)::_lambda(auto:1,auto:2)_1_>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_itm_common_hpp:846:35)>
                )solver);
    break;
  case lagrangian_incr:
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::compute_order::run<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,double>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,double,double,double)::_lambda(auto:1,auto:2)_2_>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_itm_common_hpp:855:35)>
                )solver);
    break;
  case pi_sign_change:
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,rng);
    solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
    ::
    compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
                *)solver,x,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,kappa,delta,theta);
    iVar1 = local_compute_violated_constraints<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array>
                      (this,solver,x);
    return iVar1;
  }
  solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
  ::
  compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
              *)solver,x,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,kappa,delta,theta);
LAB_004f0f7a:
  iVar1 = compute_violated_constraints<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array>
                    (solver,x,&this->R);
  return iVar1;
}

Assistant:

int run(Solver& solver,
            Xtype& x,
            random_engine& rng,
            Float kappa,
            Float delta,
            Float theta)
    {
        bool pi_changed = false;
        int remaining = 0;

        switch (order) {
        case solver_parameters::constraint_order::reversing:
            solver.compute_update_row(
              x, R.crbegin(), R.crend(), kappa, delta, theta);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::random_sorting:
            std::shuffle(R.begin(), R.end(), rng);

            solver.compute_update_row(
              x, R.begin(), R.end(), kappa, delta, theta);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::infeasibility_decr:
            std::sort(m_order.begin(),
                      m_order.end(),
                      [](const auto& lhs, const auto& rhs) {
                          return rhs.second < lhs.second;
                      });
            solver.compute_update_row(
              x, m_order.cbegin(), m_order.cend(), kappa, delta, theta);

            return infeasibility_local_compute_violated_constraints(solver, x);
        case solver_parameters::constraint_order::infeasibility_incr:
            std::sort(m_order.begin(),
                      m_order.end(),
                      [](const auto& lhs, const auto& rhs) {
                          return lhs.second < rhs.second;
                      });
            solver.compute_update_row(
              x, m_order.cbegin(), m_order.cend(), kappa, delta, theta);

            return infeasibility_local_compute_violated_constraints(solver, x);
        case solver_parameters::constraint_order::lagrangian_decr:
            std::sort(
              R.begin(), R.end(), [&solver](const auto lhs, const auto rhs) {
                  return solver.pi[rhs] < solver.pi[lhs];
              });
            solver.compute_update_row(
              x, R.cbegin(), R.cend(), kappa, delta, theta);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::lagrangian_incr:
            std::sort(
              R.begin(), R.end(), [&solver](const auto lhs, const auto rhs) {
                  return solver.pi[lhs] < solver.pi[rhs];
              });

            solver.compute_update_row(
              x, R.cbegin(), R.cend(), kappa, delta, theta);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::pi_sign_change:
            std::shuffle(R.begin(), R.end(), rng);

            pi_changed = solver.compute_update_row(
              x, R.begin(), R.end(), kappa, delta, theta);
            remaining = local_compute_violated_constraints(solver, x);

            if (!pi_changed && remaining == 0)
                return 0;

            return remaining;
        case solver_parameters::constraint_order::none:
        default:
            solver.compute_update_row(
              x, R.begin(), R.end(), kappa, delta, theta);
            return compute_violated_constraints(solver, x, R);
        }
    }